

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O3

void * memory_allocator_allocate(memory_allocator allocator,size_t size)

{
  size_t *psVar1;
  void *pvVar2;
  
  pvVar2 = (*allocator->iface->allocate)(allocator->impl,size);
  psVar1 = &(allocator->size).alloc + (pvVar2 == (void *)0x0);
  *psVar1 = *psVar1 + 1;
  return pvVar2;
}

Assistant:

void *memory_allocator_allocate(memory_allocator allocator, size_t size)
{
	void *data = allocator->iface->allocate(allocator->impl, size);

	if (data == NULL)
	{
		++allocator->size.bad_alloc;
	}
	else
	{
		++allocator->size.alloc;
	}

	return data;
}